

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOutReference_GetSerializeSize_Test::TestBody
          (ConfidentialTxOutReference_GetSerializeSize_Test *this)

{
  bool *pbVar1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  Message local_258;
  AssertHelper local_250;
  AssertionResult gtest_ar;
  uint32_t no_wit_size;
  uint32_t wit_size;
  uint32_t cache_size;
  ConfidentialAssetId asset;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  
  pbVar1 = &txout.super_AbstractTxOut.value_.ignore_check_;
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txout,"1234567890123456789012345678901234567890123456789012345678901234","")
  ;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&txout);
  if (txout.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(txout.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  gtest_ar._0_8_ = AVar4.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar4.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&txout_ref,(Amount *)&gtest_ar);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&txout,&exp_script,&asset,(ConfidentialValue *)&txout_ref);
  txout_ref.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if (txout_ref.super_AbstractTxOutReference.value_.amount_ != 0) {
    operator_delete((void *)txout_ref.super_AbstractTxOutReference.value_.amount_);
  }
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout_ref,&txout);
  wit_size = 0;
  no_wit_size = 0;
  local_258.ss_.ptr_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeSize
                 (&txout_ref,false,&wit_size,&no_wit_size,0,0x34,(uint32_t *)0x0,0);
  local_250.data_._0_4_ = 0x44;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txout_ref.GetSerializeSize(false, &wit_size, &no_wit_size)","68"
             ,(uint *)&local_258,(int *)&local_250);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x136,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"wit_size","2",&wit_size,(int *)&local_258);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x137,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x42;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"no_wit_size","66",&no_wit_size,(int *)&local_258);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x138,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cache_size = 0;
  wit_size = 0;
  no_wit_size = 0;
  local_258.ss_.ptr_._0_4_ = 0xc69;
  local_250.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeSize
                 (&txout_ref,true,&wit_size,&no_wit_size,0,0x24,&cache_size,0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"3177",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size)"
             ,(int *)&local_258,(uint *)&local_250);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0xbef;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"3055","wit_size",(int *)&local_258,&wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x7a;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"122","no_wit_size",(int *)&local_258,&no_wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0xb4c;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"2892","cache_size",(int *)&local_258,&cache_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cache_size = 0;
  local_258.ss_.ptr_._0_4_ = 0x116a;
  local_250.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeSize
                 (&txout_ref,true,&wit_size,&no_wit_size,0,0x34,&cache_size,0x100);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4458",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 256)"
             ,(int *)&local_258,(uint *)&local_250);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x148,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x10f0;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4336","wit_size",(int *)&local_258,&wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x149,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x7a;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"122","no_wit_size",(int *)&local_258,&no_wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x104d;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4173","cache_size",(int *)&local_258,&cache_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x14b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cache_size = 0;
  local_258.ss_.ptr_._0_4_ = 0x112b;
  local_250.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeSize
                 (&txout_ref,true,&wit_size,&no_wit_size,0,0x34,&cache_size,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4395",
             "txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 2)"
             ,(int *)&local_258,(uint *)&local_250);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x10b1;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4273","wit_size",(int *)&local_258,&wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x151,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x7a;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"122","no_wit_size",(int *)&local_258,&no_wit_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x152,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_258.ss_.ptr_._0_4_ = 0x104d;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"4173","cache_size",(int *)&local_258,&cache_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_258);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x153,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_258.ss_.ptr_._4_4_,(uint32_t)local_258.ss_.ptr_) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout_ref);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}